

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.c
# Opt level: O1

double sampleSimplex2D(PerlinNoise *noise,double x,double y)

{
  byte bVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 auVar5 [16];
  char cVar6;
  int iVar7;
  uint uVar8;
  undefined4 uVar9;
  uint uVar10;
  undefined4 uVar11;
  double dVar12;
  double d;
  double d_00;
  double dVar13;
  double dStack_50;
  double dStack_40;
  
  dVar12 = (x + y) * 0.3660254037844386;
  auVar3._8_4_ = SUB84(y,0);
  auVar3._0_8_ = x;
  auVar3._12_4_ = (int)((ulong)y >> 0x20);
  dVar13 = dVar12 + x;
  dVar12 = dVar12 + y;
  auVar5._8_4_ = SUB84(dVar12,0);
  auVar5._0_8_ = dVar13;
  auVar5._12_4_ = (int)((ulong)dVar12 >> 0x20);
  dVar12 = floor(dVar13);
  dStack_50 = auVar5._8_8_;
  dVar13 = floor(dStack_50);
  dStack_40 = auVar3._8_8_;
  iVar7 = (int)dVar12;
  uVar8 = (uint)dVar13;
  dVar12 = (double)(int)(iVar7 + uVar8) * 0.21132486540518713;
  dVar13 = x - ((double)iVar7 - dVar12);
  dStack_40 = dStack_40 - ((double)(int)uVar8 - dVar12);
  uVar10 = 0x3ff00000;
  dVar12 = 1.0;
  if (dVar13 <= dStack_40) {
    dVar12 = 0.0;
  }
  if (dStack_40 < dVar13) {
    uVar10 = 0;
  }
  uVar9 = 0x74df99c8;
  uVar11 = 0x3fdb0cb1;
  d = dStack_40 + -1.0 + 0.42264973081037427;
  cVar6 = (char)iVar7;
  bVar1 = noise->d[(byte)((dStack_40 < dVar13) + cVar6 +
                         noise->d[(dVar13 <= dStack_40) + uVar8 & 0xff])];
  bVar2 = noise->d[(byte)(noise->d[uVar8 + 1 & 0xff] + cVar6 + 1)];
  d_00 = d;
  dVar4 = simplexGrad((uint)(byte)(noise->d[(byte)(noise->d[uVar8 & 0xff] + cVar6)] +
                                  (noise->d[(byte)(noise->d[uVar8 & 0xff] + cVar6)] / 3 & 0xfc) * -3
                                  ),dVar13,dStack_40,0.42264973081037427,d);
  dVar12 = simplexGrad((uint)(byte)(bVar1 + (bVar1 / 3 & 0xfc) * -3),
                       (dVar13 - dVar12) + 0.21132486540518713,
                       (dStack_40 - (double)((ulong)uVar10 << 0x20)) + 0.21132486540518713,
                       (double)CONCAT44(uVar11,uVar9),d_00);
  dVar13 = simplexGrad((uint)(byte)(bVar2 + (bVar2 / 3 & 0xfc) * -3),
                       dVar13 + -1.0 + 0.42264973081037427,d,(double)CONCAT44(uVar11,uVar9),d_00);
  return (dVar13 + dVar12 + dVar4 + 0.0) * 70.0;
}

Assistant:

double sampleSimplex2D(const PerlinNoise *noise, double x, double y)
{
    const double SKEW = 0.5 * (sqrt(3) - 1.0);
    const double UNSKEW = (3.0 - sqrt(3)) / 6.0;

    double hf = (x + y) * SKEW;
    int hx = (int)floor(x + hf);
    int hz = (int)floor(y + hf);
    double mhxz = (hx + hz) * UNSKEW;
    double x0 = x - (hx - mhxz);
    double y0 = y - (hz - mhxz);
    int offx = (x0 > y0);
    int offz = !offx;
    double x1 = x0 - offx + UNSKEW;
    double y1 = y0 - offz + UNSKEW;
    double x2 = x0 - 1.0 + 2.0 * UNSKEW;
    double y2 = y0 - 1.0 + 2.0 * UNSKEW;
    int gi0 = noise->d[0xff & (hz)];
    int gi1 = noise->d[0xff & (hz + offz)];
    int gi2 = noise->d[0xff & (hz + 1)];
    gi0 = noise->d[0xff & (gi0 + hx)];
    gi1 = noise->d[0xff & (gi1 + hx + offx)];
    gi2 = noise->d[0xff & (gi2 + hx + 1)];
    double t = 0;
    t += simplexGrad(gi0 % 12, x0, y0, 0.0, 0.5);
    t += simplexGrad(gi1 % 12, x1, y1, 0.0, 0.5);
    t += simplexGrad(gi2 % 12, x2, y2, 0.0, 0.5);
    return 70.0 * t;
}